

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

void __thiscall TPZMatrix<TPZFlopCounter>::Identity(TPZMatrix<TPZFlopCounter> *this)

{
  _func_int **pp_Var1;
  long lVar2;
  long lVar3;
  long lVar4;
  undefined8 local_30;
  
  lVar3 = (this->super_TPZBaseMatrix).fCol;
  if (lVar3 != (this->super_TPZBaseMatrix).fRow) {
    Error("identity (TPZMatrix<>*) <TPZMatrix<>must be square>",(char *)0x0);
    lVar3 = (this->super_TPZBaseMatrix).fRow;
  }
  if (0 < lVar3) {
    lVar2 = (this->super_TPZBaseMatrix).fCol;
    lVar4 = 0;
    do {
      if (0 < lVar2) {
        lVar3 = 0;
        do {
          if (lVar4 == lVar3) {
            local_30 = 0x3ff0000000000000;
            pp_Var1 = (this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable;
            lVar2 = lVar4;
          }
          else {
            local_30 = 0;
            pp_Var1 = (this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable;
            lVar2 = lVar3;
          }
          (*pp_Var1[0x23])(this,lVar4,lVar2,&local_30);
          lVar3 = lVar3 + 1;
          lVar2 = (this->super_TPZBaseMatrix).fCol;
        } while (lVar3 < lVar2);
        lVar3 = (this->super_TPZBaseMatrix).fRow;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < lVar3);
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::Identity() {
	
    if ( Cols() != Rows() ) {
        Error( "identity (TPZMatrix<>*) <TPZMatrix<>must be square>" );
    }
    for ( int64_t row = 0; row < Rows(); row++) {
        for ( int64_t col = 0; col < Cols(); col++ ) {
            (row == col)? PutVal(row,col,1.):PutVal(row,col,0.);
        }
    }
}